

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz.c
# Opt level: O0

void sz_boot(sc_data_t *sc_data)

{
  sc_data_t *in_RDI;
  
  sz_boot_pind2sz_tab(in_RDI);
  sz_boot_index2size_tab(in_RDI);
  sz_boot_size2index_tab(in_RDI);
  return;
}

Assistant:

void
sz_boot(const sc_data_t *sc_data) {
	sz_boot_pind2sz_tab(sc_data);
	sz_boot_index2size_tab(sc_data);
	sz_boot_size2index_tab(sc_data);
}